

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall
wallet::CWallet::AddActiveScriptPubKeyManWithDb
          (CWallet *this,WalletBatch *batch,uint256 id,OutputType type,bool internal)

{
  uint256 id_00;
  bool bVar1;
  runtime_error *this_00;
  long in_FS_OFFSET;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = WalletBatch::WriteActiveScriptPubKeyMan(batch,(uint8_t)type,&id,internal);
  if (bVar1) {
    id_00.super_base_blob<256U>.m_data._M_elems[8] = id.super_base_blob<256U>.m_data._M_elems[8];
    id_00.super_base_blob<256U>.m_data._M_elems[9] = id.super_base_blob<256U>.m_data._M_elems[9];
    id_00.super_base_blob<256U>.m_data._M_elems[10] = id.super_base_blob<256U>.m_data._M_elems[10];
    id_00.super_base_blob<256U>.m_data._M_elems[0xb] = id.super_base_blob<256U>.m_data._M_elems[0xb]
    ;
    id_00.super_base_blob<256U>.m_data._M_elems[0xc] = id.super_base_blob<256U>.m_data._M_elems[0xc]
    ;
    id_00.super_base_blob<256U>.m_data._M_elems[0xd] = id.super_base_blob<256U>.m_data._M_elems[0xd]
    ;
    id_00.super_base_blob<256U>.m_data._M_elems[0xe] = id.super_base_blob<256U>.m_data._M_elems[0xe]
    ;
    id_00.super_base_blob<256U>.m_data._M_elems[0xf] = id.super_base_blob<256U>.m_data._M_elems[0xf]
    ;
    id_00.super_base_blob<256U>.m_data._M_elems[0] = id.super_base_blob<256U>.m_data._M_elems[0];
    id_00.super_base_blob<256U>.m_data._M_elems[1] = id.super_base_blob<256U>.m_data._M_elems[1];
    id_00.super_base_blob<256U>.m_data._M_elems[2] = id.super_base_blob<256U>.m_data._M_elems[2];
    id_00.super_base_blob<256U>.m_data._M_elems[3] = id.super_base_blob<256U>.m_data._M_elems[3];
    id_00.super_base_blob<256U>.m_data._M_elems[4] = id.super_base_blob<256U>.m_data._M_elems[4];
    id_00.super_base_blob<256U>.m_data._M_elems[5] = id.super_base_blob<256U>.m_data._M_elems[5];
    id_00.super_base_blob<256U>.m_data._M_elems[6] = id.super_base_blob<256U>.m_data._M_elems[6];
    id_00.super_base_blob<256U>.m_data._M_elems[7] = id.super_base_blob<256U>.m_data._M_elems[7];
    id_00.super_base_blob<256U>.m_data._M_elems[0x10] =
         id.super_base_blob<256U>.m_data._M_elems[0x10];
    id_00.super_base_blob<256U>.m_data._M_elems[0x11] =
         id.super_base_blob<256U>.m_data._M_elems[0x11];
    id_00.super_base_blob<256U>.m_data._M_elems[0x12] =
         id.super_base_blob<256U>.m_data._M_elems[0x12];
    id_00.super_base_blob<256U>.m_data._M_elems[0x13] =
         id.super_base_blob<256U>.m_data._M_elems[0x13];
    id_00.super_base_blob<256U>.m_data._M_elems[0x14] =
         id.super_base_blob<256U>.m_data._M_elems[0x14];
    id_00.super_base_blob<256U>.m_data._M_elems[0x15] =
         id.super_base_blob<256U>.m_data._M_elems[0x15];
    id_00.super_base_blob<256U>.m_data._M_elems[0x16] =
         id.super_base_blob<256U>.m_data._M_elems[0x16];
    id_00.super_base_blob<256U>.m_data._M_elems[0x17] =
         id.super_base_blob<256U>.m_data._M_elems[0x17];
    id_00.super_base_blob<256U>.m_data._M_elems[0x18] =
         id.super_base_blob<256U>.m_data._M_elems[0x18];
    id_00.super_base_blob<256U>.m_data._M_elems[0x19] =
         id.super_base_blob<256U>.m_data._M_elems[0x19];
    id_00.super_base_blob<256U>.m_data._M_elems[0x1a] =
         id.super_base_blob<256U>.m_data._M_elems[0x1a];
    id_00.super_base_blob<256U>.m_data._M_elems[0x1b] =
         id.super_base_blob<256U>.m_data._M_elems[0x1b];
    id_00.super_base_blob<256U>.m_data._M_elems[0x1c] =
         id.super_base_blob<256U>.m_data._M_elems[0x1c];
    id_00.super_base_blob<256U>.m_data._M_elems[0x1d] =
         id.super_base_blob<256U>.m_data._M_elems[0x1d];
    id_00.super_base_blob<256U>.m_data._M_elems[0x1e] =
         id.super_base_blob<256U>.m_data._M_elems[0x1e];
    id_00.super_base_blob<256U>.m_data._M_elems[0x1f] =
         id.super_base_blob<256U>.m_data._M_elems[0x1f];
    LoadActiveScriptPubKeyMan(this,id_00,type,internal);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"AddActiveScriptPubKeyManWithDb",&local_69);
    std::operator+(&local_48,&local_68,": writing active ScriptPubKeyMan id failed");
    std::runtime_error::runtime_error(this_00,(string *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::AddActiveScriptPubKeyManWithDb(WalletBatch& batch, uint256 id, OutputType type, bool internal)
{
    if (!batch.WriteActiveScriptPubKeyMan(static_cast<uint8_t>(type), id, internal)) {
        throw std::runtime_error(std::string(__func__) + ": writing active ScriptPubKeyMan id failed");
    }
    LoadActiveScriptPubKeyMan(id, type, internal);
}